

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::detail::BufferStream::~BufferStream(BufferStream *this)

{
  BufferStream *this_local;
  
  ~BufferStream(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~BufferStream() override = default;